

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameWalkWith(Walker *pWalker,Select *pSelect)

{
  undefined1 local_60 [8];
  NameContext sNC;
  Select *p;
  int i;
  Select *pSelect_local;
  Walker *pWalker_local;
  
  if (pSelect->pWith != (With *)0x0) {
    for (p._4_4_ = 0; p._4_4_ < pSelect->pWith->nCte; p._4_4_ = p._4_4_ + 1) {
      sNC.pWinSelect = pSelect->pWith->a[p._4_4_].pSelect;
      memset(local_60,0,0x38);
      local_60 = (undefined1  [8])pWalker->pParse;
      sqlite3SelectPrep((Parse *)local_60,sNC.pWinSelect,(NameContext *)local_60);
      sqlite3WalkSelect(pWalker,sNC.pWinSelect);
    }
  }
  return;
}

Assistant:

static void renameWalkWith(Walker *pWalker, Select *pSelect){
  if( pSelect->pWith ){
    int i;
    for(i=0; i<pSelect->pWith->nCte; i++){
      Select *p = pSelect->pWith->a[i].pSelect;
      NameContext sNC;
      memset(&sNC, 0, sizeof(sNC));
      sNC.pParse = pWalker->pParse;
      sqlite3SelectPrep(sNC.pParse, p, &sNC);
      sqlite3WalkSelect(pWalker, p);
    }
  }
}